

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O2

void sec_flush_all_locked(tsdn_t *tsdn,sec_t *sec,sec_shard_t *shard)

{
  sec_bin_t *psVar1;
  pszind_t i;
  ulong uVar2;
  long lVar3;
  _Bool deferred_work_generated;
  edata_list_active_t to_flush;
  
  shard->bytes_cur = 0;
  to_flush.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
  lVar3 = 0x10;
  for (uVar2 = 0; uVar2 < sec->npsizes; uVar2 = uVar2 + 1) {
    psVar1 = shard->bins;
    *(undefined8 *)((long)psVar1 + lVar3 + -8) = 0;
    edata_list_active_concat(&to_flush,(edata_list_active_t *)(&psVar1->being_batch_filled + lVar3))
    ;
    lVar3 = lVar3 + 0x18;
  }
  deferred_work_generated = false;
  (*sec->fallback->dalloc_batch)(tsdn,sec->fallback,&to_flush,&deferred_work_generated);
  return;
}

Assistant:

static void
sec_flush_all_locked(tsdn_t *tsdn, sec_t *sec, sec_shard_t *shard) {
	malloc_mutex_assert_owner(tsdn, &shard->mtx);
	shard->bytes_cur = 0;
	edata_list_active_t to_flush;
	edata_list_active_init(&to_flush);
	for (pszind_t i = 0; i < sec->npsizes; i++) {
		sec_bin_t *bin = &shard->bins[i];
		bin->bytes_cur = 0;
		edata_list_active_concat(&to_flush, &bin->freelist);
	}

	/*
	 * Ordinarily we would try to avoid doing the batch deallocation while
	 * holding the shard mutex, but the flush_all pathways only happen when
	 * we're disabling the HPA or resetting the arena, both of which are
	 * rare pathways.
	 */
	bool deferred_work_generated = false;
	pai_dalloc_batch(tsdn, sec->fallback, &to_flush,
	    &deferred_work_generated);
}